

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (mxx *__return_storage_ptr__,impl *this,
          __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
          begin,int param_4,comm *param_5,size_t param_6)

{
  size_t sVar1;
  int iVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  reference pTVar5;
  reference pvVar6;
  iterator iVar7;
  iterator iVar8;
  MPI_Comm poVar9;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_f8;
  long local_f0;
  size_t bucket_size_1;
  size_t i_1;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  pos_1;
  undefined1 local_c0 [8];
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> all_samples;
  size_t bucket_size;
  size_t i;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  pos;
  unsigned_long local_78;
  ulong local_70;
  unsigned_long local_68;
  size_t local_s;
  unsigned_long uStack_58;
  int p;
  size_t total_size;
  impl *local_48;
  ulong local_40;
  size_t local_size;
  MPI_Datatype mpi_dt_local;
  comm *comm_local;
  int s_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  end_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  begin_local;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *local_splitters;
  
  total_size = (size_t)begin._M_current;
  local_48 = this;
  local_size = param_6;
  mpi_dt_local = (MPI_Datatype)param_5;
  comm_local._0_4_ = param_4;
  _s_local = begin._M_current;
  end_local._M_current = (TwoBSA<unsigned_long> *)this;
  local_40 = std::
             distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                       ((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                         )this,begin);
  uStack_58 = allreduce<unsigned_long>(&local_40,(comm *)mpi_dt_local);
  local_s._4_4_ = mxx::comm::size((comm *)mpi_dt_local);
  if (local_40 == 0) {
    local_68 = 0;
  }
  else {
    local_70 = ((local_40 * (long)(int)comm_local * (long)local_s._4_4_ + uStack_58) - 1) /
               uStack_58;
    local_78 = 1;
    puVar3 = std::max<unsigned_long>(&local_70,&local_78);
    local_68 = *puVar3;
  }
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
             __return_storage_ptr__);
  if (local_68 != 0) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
               __return_storage_ptr__,local_68);
    i = (size_t)end_local._M_current;
    for (bucket_size = 0;
        sVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                          ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *
                           )__return_storage_ptr__), bucket_size < sVar4;
        bucket_size = bucket_size + 1) {
      all_samples.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(local_40 / (local_68 + 1) +
                    (long)(int)(uint)(bucket_size < local_40 % (local_68 + 1)));
      __gnu_cxx::
      __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
      ::operator+=((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                    *)&i,(difference_type)
                         ((long)&all_samples.
                                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].SA + 7));
      pTVar5 = __gnu_cxx::
               __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
               ::operator*((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                            *)&i);
      pvVar6 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
               operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                          __return_storage_ptr__,bucket_size);
      pvVar6->B1 = pTVar5->B1;
      pvVar6->B2 = pTVar5->B2;
      pvVar6->SA = pTVar5->SA;
      __gnu_cxx::
      __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
      ::operator++((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                    *)&i);
    }
  }
  gatherv<TwoBSA<unsigned_long>>
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_c0,
             __return_storage_ptr__,
             (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)0x0,
             (int)mpi_dt_local,param_5);
  iVar2 = mxx::comm::rank((comm *)mpi_dt_local);
  if (iVar2 == 0) {
    iVar7 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       local_c0);
    iVar8 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       local_c0);
    std::
    sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
              (iVar7._M_current,iVar8._M_current);
    sVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       __return_storage_ptr__);
    if (sVar4 != (long)local_s._4_4_ - 1U) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 __return_storage_ptr__,(long)(local_s._4_4_ + -1));
    }
    i_1 = (size_t)std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                              *)local_c0);
    for (bucket_size_1 = 0; sVar1 = bucket_size_1,
        sVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                          ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *
                           )__return_storage_ptr__), sVar1 < sVar4;
        bucket_size_1 = bucket_size_1 + 1) {
      local_f0 = (long)(int)((local_s._4_4_ * (int)comm_local) / local_s._4_4_ +
                            (uint)(bucket_size_1 <
                                  (ulong)(long)((local_s._4_4_ * (int)comm_local) % local_s._4_4_)))
      ;
      local_f8 = __gnu_cxx::
                 __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                 ::operator+((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                              *)&i_1,local_f0 + -1);
      pTVar5 = __gnu_cxx::
               __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
               ::operator*(&local_f8);
      pvVar6 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
               operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                          __return_storage_ptr__,bucket_size_1);
      pvVar6->B1 = pTVar5->B1;
      pvVar6->B2 = pTVar5->B2;
      pvVar6->SA = pTVar5->SA;
      __gnu_cxx::
      __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
      ::operator+=((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                    *)&i_1,local_f0);
    }
  }
  sVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     __return_storage_ptr__);
  if (sVar4 != (long)local_s._4_4_ - 1U) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
               __return_storage_ptr__,(long)(local_s._4_4_ + -1));
  }
  pvVar6 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                     ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                      __return_storage_ptr__,0);
  sVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     __return_storage_ptr__);
  sVar1 = local_size;
  poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)mpi_dt_local);
  MPI_Bcast(pvVar6,sVar4 & 0xffffffff,sVar1,0,poVar9);
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_c0);
  return (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);

    // get total size n
    std::size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    std::size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<std::size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    //. init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    std::vector<value_type> all_samples = mxx::gatherv(local_splitters, 0, comm);

    // sort and pick p-1 samples on master
    if (comm.rank() == 0) {
        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1)
        {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }

    // size splitters for receiving
    if (local_splitters.size() != (size_t)p-1) {
        local_splitters.resize(p-1);
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}